

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true>::push_back
          (SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true> *this,
          pair<const_char_*,_llvm::cl::SubCommand_*> *Elt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined8 *puVar4;
  pair<const_char_*,_llvm::cl::SubCommand_*> *Elt_local;
  SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true> *this_local;
  
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  sVar3 = SmallVectorBase::capacity((SmallVectorBase *)this);
  if (sVar3 <= sVar2) {
    grow(this,0);
  }
  pvVar1 = (this->
           super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>).
           super_SmallVectorBase.BeginX;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  puVar4 = (undefined8 *)((long)pvVar1 + sVar2 * 0x10);
  *puVar4 = Elt->first;
  puVar4[1] = Elt->second;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar2 + 1);
  return;
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(this->end(), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }